

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O3

void bhf::ads::ParseDwordData(RegistryEntry *value,char **it,istream *param_3,size_t *lineNumber)

{
  char *pcVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  long lVar4;
  uint32_t v;
  stringstream converter;
  stringstream ss_1;
  string local_360 [32];
  stringstream local_340 [16];
  long local_330 [3];
  uint auStack_318 [22];
  ios_base local_2c0 [264];
  undefined4 local_1b8 [4];
  ostream local_1a8 [376];
  
  if (**it == '\0') {
    std::__cxx11::stringstream::stringstream(local_340);
    if (*lineNumber == 0xffffffffffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"Invalid network data: ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"invalid dword hex character length (no data)",0x2c);
      local_1b8[0] = CONCAT31(local_1b8[0]._1_3_,10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)local_1b8,1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"Invalid file format: ",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"invalid dword hex character length (no data)",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330," in line ",9);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
      local_1b8[0] = CONCAT31(local_1b8[0]._1_3_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1b8,1);
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_1b8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_340);
  pcVar1 = *it;
  lVar4 = -8;
  do {
    if (*pcVar1 == '\0') goto LAB_0011e3d5;
    *(uint *)((long)auStack_318 + *(long *)(local_330[0] + -0x18)) =
         *(uint *)((long)auStack_318 + *(long *)(local_330[0] + -0x18)) & 0xffffffb5 | 8;
    local_1b8[0] = CONCAT31(local_1b8[0]._1_3_,*pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)local_1b8,1);
    pcVar1 = *it + 1;
    *it = pcVar1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  if (*pcVar1 != '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    if (*lineNumber == 0xffffffffffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid network data: ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"invalid dword hex character length (too long)",0x2d);
      local_360[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_360,1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid file format: ",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"invalid dword hex character length (too long)",0x2d);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," in line ",9);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      local_360[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_360,1);
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_360);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0011e3d5:
  std::istream::_M_extract<unsigned_int>((uint *)local_340);
  local_1b8[0] = 0;
  RegistryEntry::Append(value,local_1b8,4);
  value->dataLen = value->dataLen + 4;
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  return;
}

Assistant:

static void ParseDwordData(bhf::ads::RegistryEntry& value, const char*& it, std::istream& /*input*/, size_t& lineNumber)
{
    if ('\0' == *it) {
        PARSING_EXCEPTION("invalid dword hex character length (no data)");
    }

    uint32_t v = 0;
    std::stringstream converter;
    for (auto i = 2 * sizeof(v); i; --i, ++it) {
        if ('\0' == *it) {
            break;
        }
        converter << std::hex << *it;
    }
    if ('\0' != *it) {
        PARSING_EXCEPTION("invalid dword hex character length (too long)");
    }

    converter >> v;
    value.PushData(v);
}